

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

int ON_wString::CompareAttributeName(wchar_t *name1,wchar_t *name2)

{
  wchar_t *pwVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  
  if (name1 == name2) {
    return 0;
  }
  if (name2 == (wchar_t *)0x0 || name1 == (wchar_t *)0x0) goto LAB_005c4d82;
  pwVar8 = name2;
  uVar3 = Internal_NameAttributeWideCharRank(*name1,SUB81(name2,0));
  uVar4 = Internal_NameAttributeWideCharRank(*name2,SUB81(pwVar8,0));
  pwVar7 = name2;
  if (uVar3 - 1 < 0xfffffffe && uVar3 == uVar4) {
    do {
      name2 = pwVar7 + 1;
      pwVar1 = name1 + 1;
      name1 = name1 + 1;
      uVar3 = Internal_NameAttributeWideCharRank(*pwVar1,SUB81(pwVar8,0));
      uVar4 = Internal_NameAttributeWideCharRank(pwVar7[1],SUB81(pwVar8,0));
      if (uVar3 != uVar4) break;
      pwVar7 = name2;
    } while (uVar3 - 1 < 0xfffffffe);
  }
  uVar6 = uVar4 & uVar3;
  if (uVar6 == 0xffffffff) {
LAB_005c4d78:
    bVar2 = true;
  }
  else {
    if (uVar3 < uVar4) {
      uVar6 = 0xffffffff;
    }
    else {
      uVar6 = 0;
      if (uVar4 < uVar3) {
        uVar6 = 1;
      }
      else if (uVar3 != 0) goto LAB_005c4d78;
    }
    bVar2 = false;
  }
  if (!bVar2) {
    return uVar6;
  }
LAB_005c4d82:
  iVar5 = ON_StringCompareOrdinalUTF32((ON__UINT32 *)name1,-1,(ON__UINT32 *)name2,-1,true);
  return iVar5;
}

Assistant:

int ON_wString::CompareAttributeName(
  const wchar_t* name1,
  const wchar_t* name2
  )
{
  if (name1 == name2)
    return 0;

  const bool bIgnoreCase = true;

  if ( nullptr != name1 && nullptr != name2 )
  {
    // Sort leading underbar before 'A'
    // https://mcneel.myjetbrains.com/youtrack/issue/RH-41224

    unsigned int rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
    unsigned int rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    while (rank1 == rank2 && ON_UNSET_UINT_INDEX != rank1 && 0 != rank1)
    {
      name1++;
      name2++;
      rank1 = Internal_NameAttributeWideCharRank(*name1,bIgnoreCase);
      rank2 = Internal_NameAttributeWideCharRank(*name2,bIgnoreCase);
    }

    if (ON_UNSET_UINT_INDEX != rank1 || ON_UNSET_UINT_INDEX != rank2)
    {
      if (rank1 < rank2)
        return -1;
      if (rank1 > rank2)
        return 1;
      if (0 == rank1)
        return 0;
    }
  }

  // name1 or name2 is nullptr or begins with an unranked code point.
  return ON_wString::CompareOrdinal(name1, -1, name2, -1, bIgnoreCase);
}